

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangulated_Surface.h
# Opt level: O0

void __thiscall
Nova::Triangulated_Surface<float>::Write_OBJ(Triangulated_Surface<float> *this,string *filename)

{
  ostream *poVar1;
  size_t sVar2;
  ostream *poVar3;
  Vector<float,_3,_true> *pVVar4;
  float *pfVar5;
  void *pvVar6;
  Vector<int,_3,_true> *pVVar7;
  int *piVar8;
  int iVar9;
  ulong local_30;
  size_t i_1;
  size_t i;
  ostream *output;
  string *filename_local;
  Triangulated_Surface<float> *this_local;
  
  poVar1 = (ostream *)Nova::File_Utilities::Safe_Open_Output((string *)filename,false);
  if (poVar1 != (ostream *)0x0) {
    for (i_1 = 0; sVar2 = Array<Nova::Vector<float,_3,_true>_>::size
                                    ((Array<Nova::Vector<float,_3,_true>_> *)this), i_1 < sVar2;
        i_1 = i_1 + 1) {
      poVar3 = std::operator<<(poVar1,"v ");
      iVar9 = (int)i_1;
      pVVar4 = Array<Nova::Vector<float,_3,_true>_>::operator[]
                         ((Array<Nova::Vector<float,_3,_true>_> *)this,iVar9);
      pfVar5 = Vector<float,_3,_true>::operator[](pVVar4,0);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar5);
      poVar3 = std::operator<<(poVar3," ");
      pVVar4 = Array<Nova::Vector<float,_3,_true>_>::operator[]
                         ((Array<Nova::Vector<float,_3,_true>_> *)this,iVar9);
      pfVar5 = Vector<float,_3,_true>::operator[](pVVar4,1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar5);
      poVar3 = std::operator<<(poVar3," ");
      pVVar4 = Array<Nova::Vector<float,_3,_true>_>::operator[]
                         ((Array<Nova::Vector<float,_3,_true>_> *)this,iVar9);
      pfVar5 = Vector<float,_3,_true>::operator[](pVVar4,2);
      pvVar6 = (void *)std::ostream::operator<<(poVar3,*pfVar5);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    }
    for (local_30 = 0;
        sVar2 = Array<Nova::Vector<int,_3,_true>_>::size(&(this->super_Simplex_Mesh<3>).elements),
        local_30 < sVar2; local_30 = local_30 + 1) {
      poVar3 = std::operator<<(poVar1,"f ");
      iVar9 = (int)local_30;
      pVVar7 = Array<Nova::Vector<int,_3,_true>_>::operator[]
                         (&(this->super_Simplex_Mesh<3>).elements,iVar9);
      piVar8 = Vector<int,_3,_true>::operator[](pVVar7,0);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar8 + 1);
      poVar3 = std::operator<<(poVar3," ");
      pVVar7 = Array<Nova::Vector<int,_3,_true>_>::operator[]
                         (&(this->super_Simplex_Mesh<3>).elements,iVar9);
      piVar8 = Vector<int,_3,_true>::operator[](pVVar7,1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar8 + 1);
      poVar3 = std::operator<<(poVar3," ");
      pVVar7 = Array<Nova::Vector<int,_3,_true>_>::operator[]
                         (&(this->super_Simplex_Mesh<3>).elements,iVar9);
      piVar8 = Vector<int,_3,_true>::operator[](pVVar7,2);
      pvVar6 = (void *)std::ostream::operator<<(poVar3,*piVar8 + 1);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    }
  }
  if (poVar1 != (ostream *)0x0) {
    (**(code **)(*(long *)poVar1 + 8))();
  }
  return;
}

Assistant:

void Write_OBJ(const std::string& filename)
    {
        std::ostream *output=File_Utilities::Safe_Open_Output(filename,false);
        if(output!=nullptr)
        {
            for(size_t i=0;i<points.size();++i) *output<<"v "<<points[i][0]<<" "<<points[i][1]<<" "<<points[i][2]<<std::endl;
            for(size_t i=0;i<elements.size();++i) *output<<"f "<<elements[i][0]+1<<" "<<elements[i][1]+1<<" "<<elements[i][2]+1<<std::endl;
        }
        delete output;
    }